

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O3

void __thiscall
serialize_tests::CSerializeMethodsTestSingle::
SerializationOps<DataStream,serialize_tests::CSerializeMethodsTestSingle,ActionUnserialize>
          (CSerializeMethodsTestSingle *this,DataStream *obj,undefined8 param_3,size_t param_4)

{
  long in_FS_OFFSET;
  uint32_t obj_1;
  ParamsStream<DataStream_&,_TransactionSerParams> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::read(obj,(int)&local_30,(void *)0x4,param_4);
  this->intval = (int)local_30.m_params;
  DataStream::read(obj,(int)&local_30,(void *)0x1,param_4);
  this->boolval = (char)local_30.m_params != '\0';
  Unserialize<DataStream,char>(obj,&this->stringval);
  DataStream::read(obj,(int)this + 0x28,(void *)0x10,param_4);
  local_30.m_params = &::TX_WITH_WITNESS;
  local_30.m_substream = obj;
  Unserialize<ParamsStream<DataStream&,TransactionSerParams>,CTransaction>(&local_30,&this->txval);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CSerializeMethodsTestSingle, obj)
    {
        READWRITE(obj.intval);
        READWRITE(obj.boolval);
        READWRITE(obj.stringval);
        READWRITE(obj.charstrval);
        READWRITE(TX_WITH_WITNESS(obj.txval));
    }